

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wavelet.cpp
# Opt level: O1

void idx2::ForwardCdf53(v3i *Dims3,v3i *M3,int Iter,int NLevels,u64 TformOrder,volume *Vol,
                       bool Normalize)

{
  array<idx2::subband> *paVar1;
  v3i *pvVar2;
  uint uVar3;
  undefined1 *puVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  u64 TransformOrder;
  long lVar9;
  grid *Grid;
  undefined1 auVar10 [16];
  double dVar11;
  grid G;
  v3i R3;
  v3i D3;
  v3i S3;
  grid_iterator<signed_char> ItEnd;
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_Wavelet_cpp:275:5)>
  __ScopeGuard__275;
  wav_basis_norms_static<16> BasisNorms;
  grid_iterator<double> local_250;
  int local_214;
  grid local_210;
  ulong local_1f8;
  uint local_1f0;
  ulong local_1e8;
  uint local_1e0;
  int local_1d8;
  ulong local_1d4;
  uint local_1cc;
  grid_iterator<double> local_1c8;
  array<idx2::subband> *local_190;
  char local_188;
  v3i *local_180;
  array<idx2::subband> local_178;
  undefined1 local_140 [136];
  undefined1 local_b8 [136];
  double dVar12;
  double dVar13;
  
  local_1d8 = Iter;
  local_1e0 = (Dims3->field_0).field_0.Z;
  local_1e8 = *(ulong *)&Dims3->field_0;
  local_1f0 = (Dims3->field_0).field_0.Z;
  local_1f8 = *(ulong *)&Dims3->field_0;
  local_1d4 = 0x100000001;
  local_1cc = 1;
  local_210.super_extent.From = 0;
  local_180 = Dims3;
  local_210.super_extent.Dims =
       (ulong)((Dims3->field_0).field_0.Z & 0x1fffff) << 0x2a |
       ((ulong)(uint)(Dims3->field_0).field_0.Y & 0x1fffff) << 0x15 |
       (ulong)(uint)(Dims3->field_0).field_0.X & 0x1fffff;
  local_210.Strd = 0x40000200001;
  TransformOrder = TformOrder;
  local_214 = NLevels;
  if (0 < NLevels) {
    iVar7 = 0;
    do {
      uVar8 = (uint)TransformOrder;
      uVar3 = uVar8 & 3;
      TransformOrder = TransformOrder >> 2;
      if (uVar3 == 3) {
        if (TransformOrder != 3) {
          TformOrder = TransformOrder;
        }
        local_210.Strd =
             (ulong)(local_1cc & 0x1fffff) << 0x2a |
             (local_1d4 >> 0x20 & 0x1fffff) << 0x15 | local_1d4 & 0x1fffff;
        local_1f0 = local_1e0;
        local_210.super_extent.Dims =
             (ulong)(local_1e0 & 0x1fffff) << 0x2a |
             (local_1e8 >> 0x20 & 0x1fffff) << 0x15 | local_1e8 & 0x1fffff;
        local_1f8 = local_1e8;
        iVar7 = iVar7 + 1;
        TransformOrder = TformOrder;
      }
      else {
        switch(Vol->Type) {
        case int8:
          if (uVar3 == 2) {
            FLiftCdf53Z<signed_char>(&local_210,M3,Normal,Vol);
          }
          else if (uVar3 == 1) {
            FLiftCdf53Y<signed_char>(&local_210,M3,Normal,Vol);
          }
          else {
            FLiftCdf53X<signed_char>(&local_210,M3,Normal,Vol);
          }
          break;
        case uint8:
          if (uVar3 == 2) {
            FLiftCdf53Z<unsigned_char>(&local_210,M3,Normal,Vol);
          }
          else if (uVar3 == 1) {
            FLiftCdf53Y<unsigned_char>(&local_210,M3,Normal,Vol);
          }
          else {
            FLiftCdf53X<unsigned_char>(&local_210,M3,Normal,Vol);
          }
          break;
        case int16:
          if (uVar3 == 2) {
            FLiftCdf53Z<short>(&local_210,M3,Normal,Vol);
          }
          else if (uVar3 == 1) {
            FLiftCdf53Y<short>(&local_210,M3,Normal,Vol);
          }
          else {
            FLiftCdf53X<short>(&local_210,M3,Normal,Vol);
          }
          break;
        case uint16:
          if (uVar3 == 2) {
            FLiftCdf53Z<unsigned_short>(&local_210,M3,Normal,Vol);
          }
          else if (uVar3 == 1) {
            FLiftCdf53Y<unsigned_short>(&local_210,M3,Normal,Vol);
          }
          else {
            FLiftCdf53X<unsigned_short>(&local_210,M3,Normal,Vol);
          }
          break;
        case int32:
          if (uVar3 == 2) {
            FLiftCdf53Z<int>(&local_210,M3,Normal,Vol);
          }
          else if (uVar3 == 1) {
            FLiftCdf53Y<int>(&local_210,M3,Normal,Vol);
          }
          else {
            FLiftCdf53X<int>(&local_210,M3,Normal,Vol);
          }
          break;
        case uint32:
          if (uVar3 == 2) {
            FLiftCdf53Z<unsigned_int>(&local_210,M3,Normal,Vol);
          }
          else if (uVar3 == 1) {
            FLiftCdf53Y<unsigned_int>(&local_210,M3,Normal,Vol);
          }
          else {
            FLiftCdf53X<unsigned_int>(&local_210,M3,Normal,Vol);
          }
          break;
        case int64:
          if (uVar3 == 2) {
            FLiftCdf53Z<long>(&local_210,M3,Normal,Vol);
          }
          else if (uVar3 == 1) {
            FLiftCdf53Y<long>(&local_210,M3,Normal,Vol);
          }
          else {
            FLiftCdf53X<long>(&local_210,M3,Normal,Vol);
          }
          break;
        case uint64:
          if (uVar3 == 2) {
            FLiftCdf53Z<unsigned_long>(&local_210,M3,Normal,Vol);
          }
          else if (uVar3 == 1) {
            FLiftCdf53Y<unsigned_long>(&local_210,M3,Normal,Vol);
          }
          else {
            FLiftCdf53X<unsigned_long>(&local_210,M3,Normal,Vol);
          }
          break;
        case float32:
          if (uVar3 == 2) {
            FLiftCdf53Z<float>(&local_210,M3,Normal,Vol);
          }
          else if (uVar3 == 1) {
            FLiftCdf53Y<float>(&local_210,M3,Normal,Vol);
          }
          else {
            FLiftCdf53X<float>(&local_210,M3,Normal,Vol);
          }
          break;
        case float64:
          if (uVar3 == 2) {
            FLiftCdf53Z<double>(&local_210,M3,Normal,Vol);
          }
          else if (uVar3 == 1) {
            FLiftCdf53Y<double>(&local_210,M3,Normal,Vol);
          }
          else {
            FLiftCdf53X<double>(&local_210,M3,Normal,Vol);
          }
        }
        uVar6 = (ulong)((uVar8 & 3) << 2);
        uVar3 = *(uint *)((long)&local_1e8 + uVar6) | 1;
        *(uint *)((long)&local_1f8 + uVar6) = uVar3;
        local_210.super_extent.Dims =
             (ulong)(local_1f0 & 0x1fffff) << 0x2a |
             (local_1f8 >> 0x20 & 0x1fffff) << 0x15 | local_1f8 & 0x1fffff;
        *(int *)((long)&local_1e8 + uVar6) = (int)(uVar3 + 1) >> 1;
        *(int *)((long)&local_1d4 + uVar6) = *(int *)((long)&local_1d4 + uVar6) << 1;
      }
    } while (iVar7 < local_214);
  }
  if (Normalize && 0 < local_214) {
    if (Mallocator()::Instance == '\0') {
      ForwardCdf53();
    }
    if (Mallocator()::Instance == '\0') {
      ForwardCdf53();
    }
    pvVar2 = local_180;
    local_190 = &local_178;
    local_178.Buffer.Data = (byte *)0x0;
    local_178.Buffer.Bytes = 0;
    local_178.Buffer.Alloc = (allocator *)&Mallocator()::Instance;
    local_178.Size = 0;
    local_178.Capacity = 0;
    local_178.Alloc = (allocator *)&Mallocator()::Instance;
    local_188 = '\0';
    BuildSubbands(local_180,local_214,TransformOrder,local_190);
    GetCdf53NormsFast<16>();
    if (0 < local_178.Size) {
      local_214 = local_214 * local_1d8;
      lVar9 = 0;
      do {
        dVar13 = 1.0;
        dVar12 = 1.0;
        dVar11 = 1.0;
        Grid = (grid *)(local_178.Buffer.Data + lVar9 * 0x40);
        if ((pvVar2->field_0).field_0.X != 1) {
          iVar7 = (int)*(char *)((long)&Grid[2].super_extent.From + 3);
          if (*(char *)((long)&Grid[2].super_extent.From + 6) == '\0') {
            iVar7 = iVar7 + local_214;
            if (0x10 < iVar7) goto LAB_0018bec4;
            iVar7 = iVar7 + -1;
            puVar4 = local_140;
          }
          else {
            iVar7 = iVar7 + local_214;
            puVar4 = local_b8;
            if (0xf < iVar7) goto LAB_0018bec4;
          }
          dVar13 = *(double *)(puVar4 + (long)iVar7 * 8);
        }
        if ((pvVar2->field_0).field_0.Y != 1) {
          iVar7 = (int)*(char *)((long)&Grid[2].super_extent.From + 4);
          if (*(char *)((long)&Grid[2].super_extent.From + 7) == '\0') {
            iVar7 = iVar7 + local_214;
            if (0x10 < iVar7) goto LAB_0018bec4;
            iVar7 = iVar7 + -1;
            puVar4 = local_140;
          }
          else {
            iVar7 = iVar7 + local_214;
            puVar4 = local_b8;
            if (0xf < iVar7) goto LAB_0018bec4;
          }
          dVar11 = *(double *)(puVar4 + (long)iVar7 * 8);
        }
        if ((pvVar2->field_0).field_0.Z != 1) {
          iVar7 = (int)*(char *)((long)&Grid[2].super_extent.From + 5);
          if ((char)Grid[2].super_extent.Dims == '\0') {
            iVar7 = iVar7 + local_214;
            if (0x10 < iVar7) goto LAB_0018bec4;
            iVar7 = iVar7 + -1;
            puVar4 = local_140;
          }
          else {
            iVar7 = iVar7 + local_214;
            puVar4 = local_b8;
            if (0xf < iVar7) {
LAB_0018bec4:
              __assert_fail("Idx < N",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                            ,0x20c,
                            "t &idx2::stack_array<double, 16>::operator[](int) const [t = double, N = 16]"
                           );
            }
          }
          dVar12 = *(double *)(puVar4 + (long)iVar7 * 8);
        }
        if (Vol->Type < __Invalid__) {
          dVar12 = dVar13 * dVar11 * dVar12;
          switch(Vol->Type) {
          case int8:
            End<signed_char>((grid_iterator<signed_char> *)&local_1c8,Grid,Vol);
            Begin<signed_char>((grid_iterator<signed_char> *)&local_250,Grid,Vol);
            while (local_250.Ptr != local_1c8.Ptr) {
              *(char *)local_250.Ptr = (char)(int)((double)(int)*(char *)local_250.Ptr * dVar12);
              local_250.P.field_0.field_0.X =
                   local_250.P.field_0.field_0.X + local_250.S.field_0.field_0.X;
              local_250.Ptr = (double *)((long)local_250.S.field_0.field_0.X + (long)local_250.Ptr);
              if (local_250.D.field_0.field_0.X <= local_250.P.field_0.field_0.X) {
                local_250.P.field_0.field_0.X = 0;
                local_250.P.field_0.field_0.Y =
                     local_250.P.field_0.field_0.Y + local_250.S.field_0.field_0.Y;
                lVar5 = (long)local_250.N.field_0.field_0.X;
                local_250.Ptr =
                     (double *)
                     ((long)local_250.Ptr +
                     (local_250.S.field_0.field_0.Y * lVar5 - (long)local_250.D.field_0.field_0.X));
                if (local_250.D.field_0.field_0.Y <= local_250.P.field_0.field_0.Y) {
                  local_250.P.field_0.field_0.Y = 0;
                  local_250.P.field_0.field_0.Z =
                       local_250.P.field_0.field_0.Z + local_250.S.field_0.field_0.Z;
                  local_250.Ptr =
                       (double *)
                       ((long)local_250.Ptr +
                       ((long)local_250.N.field_0.field_0.Y * local_250.S.field_0.field_0.Z * lVar5
                       - local_250.D.field_0.field_0.Y * lVar5));
                }
              }
            }
            break;
          case uint8:
            End<unsigned_char>((grid_iterator<unsigned_char> *)&local_1c8,Grid,Vol);
            Begin<unsigned_char>((grid_iterator<unsigned_char> *)&local_250,Grid,Vol);
            while (local_250.Ptr != local_1c8.Ptr) {
              *(char *)local_250.Ptr = (char)(int)((double)*(byte *)local_250.Ptr * dVar12);
              local_250.P.field_0.field_0.X =
                   local_250.P.field_0.field_0.X + local_250.S.field_0.field_0.X;
              local_250.Ptr = (double *)((long)local_250.S.field_0.field_0.X + (long)local_250.Ptr);
              if (local_250.D.field_0.field_0.X <= local_250.P.field_0.field_0.X) {
                local_250.P.field_0.field_0.X = 0;
                local_250.P.field_0.field_0.Y =
                     local_250.P.field_0.field_0.Y + local_250.S.field_0.field_0.Y;
                lVar5 = (long)local_250.N.field_0.field_0.X;
                local_250.Ptr =
                     (double *)
                     ((long)local_250.Ptr +
                     (local_250.S.field_0.field_0.Y * lVar5 - (long)local_250.D.field_0.field_0.X));
                if (local_250.D.field_0.field_0.Y <= local_250.P.field_0.field_0.Y) {
                  local_250.P.field_0.field_0.Y = 0;
                  local_250.P.field_0.field_0.Z =
                       local_250.P.field_0.field_0.Z + local_250.S.field_0.field_0.Z;
                  local_250.Ptr =
                       (double *)
                       ((long)local_250.Ptr +
                       ((long)local_250.N.field_0.field_0.Y * local_250.S.field_0.field_0.Z * lVar5
                       - local_250.D.field_0.field_0.Y * lVar5));
                }
              }
            }
            break;
          case int16:
            End<short>((grid_iterator<short> *)&local_1c8,Grid,Vol);
            Begin<short>((grid_iterator<short> *)&local_250,Grid,Vol);
            while (local_250.Ptr != local_1c8.Ptr) {
              *(short *)local_250.Ptr = (short)(int)((double)(int)*(short *)local_250.Ptr * dVar12);
              local_250.P.field_0.field_0.X =
                   local_250.P.field_0.field_0.X + local_250.S.field_0.field_0.X;
              local_250.Ptr =
                   (double *)((long)local_250.Ptr + (long)local_250.S.field_0.field_0.X * 2);
              if (local_250.D.field_0.field_0.X <= local_250.P.field_0.field_0.X) {
                local_250.P.field_0.field_0.X = 0;
                local_250.P.field_0.field_0.Y =
                     local_250.P.field_0.field_0.Y + local_250.S.field_0.field_0.Y;
                lVar5 = (long)local_250.N.field_0.field_0.X;
                local_250.Ptr =
                     (double *)
                     ((long)local_250.Ptr +
                     local_250.S.field_0.field_0.Y * lVar5 * 2 +
                     (long)local_250.D.field_0.field_0.X * -2);
                if (local_250.D.field_0.field_0.Y <= local_250.P.field_0.field_0.Y) {
                  local_250.P.field_0.field_0.Y = 0;
                  local_250.P.field_0.field_0.Z =
                       local_250.P.field_0.field_0.Z + local_250.S.field_0.field_0.Z;
                  local_250.Ptr =
                       (double *)
                       ((long)local_250.Ptr +
                       (long)local_250.N.field_0.field_0.Y * local_250.S.field_0.field_0.Z * lVar5 *
                       2 + local_250.D.field_0.field_0.Y * lVar5 * -2);
                }
              }
            }
            break;
          case uint16:
            End<unsigned_short>((grid_iterator<unsigned_short> *)&local_1c8,Grid,Vol);
            Begin<unsigned_short>((grid_iterator<unsigned_short> *)&local_250,Grid,Vol);
            while (local_250.Ptr != local_1c8.Ptr) {
              *(short *)local_250.Ptr = (short)(int)((double)*(ushort *)local_250.Ptr * dVar12);
              local_250.P.field_0.field_0.X =
                   local_250.P.field_0.field_0.X + local_250.S.field_0.field_0.X;
              local_250.Ptr =
                   (double *)((long)local_250.Ptr + (long)local_250.S.field_0.field_0.X * 2);
              if (local_250.D.field_0.field_0.X <= local_250.P.field_0.field_0.X) {
                local_250.P.field_0.field_0.X = 0;
                local_250.P.field_0.field_0.Y =
                     local_250.P.field_0.field_0.Y + local_250.S.field_0.field_0.Y;
                lVar5 = (long)local_250.N.field_0.field_0.X;
                local_250.Ptr =
                     (double *)
                     ((long)local_250.Ptr +
                     local_250.S.field_0.field_0.Y * lVar5 * 2 +
                     (long)local_250.D.field_0.field_0.X * -2);
                if (local_250.D.field_0.field_0.Y <= local_250.P.field_0.field_0.Y) {
                  local_250.P.field_0.field_0.Y = 0;
                  local_250.P.field_0.field_0.Z =
                       local_250.P.field_0.field_0.Z + local_250.S.field_0.field_0.Z;
                  local_250.Ptr =
                       (double *)
                       ((long)local_250.Ptr +
                       (long)local_250.N.field_0.field_0.Y * local_250.S.field_0.field_0.Z * lVar5 *
                       2 + local_250.D.field_0.field_0.Y * lVar5 * -2);
                }
              }
            }
            break;
          case int32:
            End<int>((grid_iterator<int> *)&local_1c8,Grid,Vol);
            Begin<int>((grid_iterator<int> *)&local_250,Grid,Vol);
            while (local_250.Ptr != local_1c8.Ptr) {
              *(int *)local_250.Ptr = (int)((double)(int)*(float *)local_250.Ptr * dVar12);
              local_250.P.field_0.field_0.X =
                   local_250.P.field_0.field_0.X + local_250.S.field_0.field_0.X;
              local_250.Ptr =
                   (double *)((long)local_250.Ptr + (long)local_250.S.field_0.field_0.X * 4);
              if (local_250.D.field_0.field_0.X <= local_250.P.field_0.field_0.X) {
                local_250.P.field_0.field_0.X = 0;
                local_250.P.field_0.field_0.Y =
                     local_250.P.field_0.field_0.Y + local_250.S.field_0.field_0.Y;
                lVar5 = (long)local_250.N.field_0.field_0.X;
                local_250.Ptr =
                     (double *)
                     ((long)local_250.Ptr +
                     local_250.S.field_0.field_0.Y * lVar5 * 4 +
                     (long)local_250.D.field_0.field_0.X * -4);
                if (local_250.D.field_0.field_0.Y <= local_250.P.field_0.field_0.Y) {
                  local_250.P.field_0.field_0.Y = 0;
                  local_250.P.field_0.field_0.Z =
                       local_250.P.field_0.field_0.Z + local_250.S.field_0.field_0.Z;
                  local_250.Ptr =
                       (double *)
                       ((long)local_250.Ptr +
                       (long)local_250.N.field_0.field_0.Y * local_250.S.field_0.field_0.Z * lVar5 *
                       4 + local_250.D.field_0.field_0.Y * lVar5 * -4);
                }
              }
            }
            break;
          case uint32:
            End<unsigned_int>((grid_iterator<unsigned_int> *)&local_1c8,Grid,Vol);
            Begin<unsigned_int>((grid_iterator<unsigned_int> *)&local_250,Grid,Vol);
            while (local_250.Ptr != local_1c8.Ptr) {
              *(float *)local_250.Ptr =
                   (float)(long)((double)(uint)*(float *)local_250.Ptr * dVar12);
              local_250.P.field_0.field_0.X =
                   local_250.P.field_0.field_0.X + local_250.S.field_0.field_0.X;
              local_250.Ptr =
                   (double *)((long)local_250.Ptr + (long)local_250.S.field_0.field_0.X * 4);
              if (local_250.D.field_0.field_0.X <= local_250.P.field_0.field_0.X) {
                local_250.P.field_0.field_0.X = 0;
                local_250.P.field_0.field_0.Y =
                     local_250.P.field_0.field_0.Y + local_250.S.field_0.field_0.Y;
                lVar5 = (long)local_250.N.field_0.field_0.X;
                local_250.Ptr =
                     (double *)
                     ((long)local_250.Ptr +
                     local_250.S.field_0.field_0.Y * lVar5 * 4 +
                     (long)local_250.D.field_0.field_0.X * -4);
                if (local_250.D.field_0.field_0.Y <= local_250.P.field_0.field_0.Y) {
                  local_250.P.field_0.field_0.Y = 0;
                  local_250.P.field_0.field_0.Z =
                       local_250.P.field_0.field_0.Z + local_250.S.field_0.field_0.Z;
                  local_250.Ptr =
                       (double *)
                       ((long)local_250.Ptr +
                       (long)local_250.N.field_0.field_0.Y * local_250.S.field_0.field_0.Z * lVar5 *
                       4 + local_250.D.field_0.field_0.Y * lVar5 * -4);
                }
              }
            }
            break;
          case int64:
            End<long>((grid_iterator<long> *)&local_1c8,Grid,Vol);
            Begin<long>((grid_iterator<long> *)&local_250,Grid,Vol);
            while (local_250.Ptr != local_1c8.Ptr) {
              *local_250.Ptr = (double)(long)((double)(long)*local_250.Ptr * dVar12);
              local_250.P.field_0.field_0.X =
                   local_250.P.field_0.field_0.X + local_250.S.field_0.field_0.X;
              local_250.Ptr = local_250.Ptr + local_250.S.field_0.field_0.X;
              if (local_250.D.field_0.field_0.X <= local_250.P.field_0.field_0.X) {
                local_250.P.field_0.field_0.X = 0;
                local_250.P.field_0.field_0.Y =
                     local_250.P.field_0.field_0.Y + local_250.S.field_0.field_0.Y;
                lVar5 = (long)local_250.N.field_0.field_0.X;
                local_250.Ptr =
                     local_250.Ptr +
                     (local_250.S.field_0.field_0.Y * lVar5 - (long)local_250.D.field_0.field_0.X);
                if (local_250.D.field_0.field_0.Y <= local_250.P.field_0.field_0.Y) {
                  local_250.P.field_0.field_0.Y = 0;
                  local_250.P.field_0.field_0.Z =
                       local_250.P.field_0.field_0.Z + local_250.S.field_0.field_0.Z;
                  local_250.Ptr =
                       local_250.Ptr +
                       ((long)local_250.N.field_0.field_0.Y * local_250.S.field_0.field_0.Z * lVar5
                       - local_250.D.field_0.field_0.Y * lVar5);
                }
              }
            }
            break;
          case uint64:
            End<unsigned_long>((grid_iterator<unsigned_long> *)&local_1c8,Grid,Vol);
            Begin<unsigned_long>((grid_iterator<unsigned_long> *)&local_250,Grid,Vol);
            while (local_250.Ptr != local_1c8.Ptr) {
              auVar10._8_8_ = 0;
              auVar10._0_8_ = *local_250.Ptr;
              auVar10 = vunpcklps_avx(auVar10,_DAT_001a8e90);
              auVar10 = vsubpd_avx(auVar10,_DAT_001a8ea0);
              dVar13 = (auVar10._0_8_ + auVar10._8_8_) * dVar12;
              uVar6 = (ulong)dVar13;
              *local_250.Ptr =
                   (double)((long)(dVar13 - 9.223372036854776e+18) & (long)uVar6 >> 0x3f | uVar6);
              local_250.P.field_0.field_0.X =
                   local_250.P.field_0.field_0.X + local_250.S.field_0.field_0.X;
              local_250.Ptr = local_250.Ptr + local_250.S.field_0.field_0.X;
              if (local_250.D.field_0.field_0.X <= local_250.P.field_0.field_0.X) {
                local_250.P.field_0.field_0.X = 0;
                local_250.P.field_0.field_0.Y =
                     local_250.P.field_0.field_0.Y + local_250.S.field_0.field_0.Y;
                lVar5 = (long)local_250.N.field_0.field_0.X;
                local_250.Ptr =
                     local_250.Ptr +
                     (local_250.S.field_0.field_0.Y * lVar5 - (long)local_250.D.field_0.field_0.X);
                if (local_250.D.field_0.field_0.Y <= local_250.P.field_0.field_0.Y) {
                  local_250.P.field_0.field_0.Y = 0;
                  local_250.P.field_0.field_0.Z =
                       local_250.P.field_0.field_0.Z + local_250.S.field_0.field_0.Z;
                  local_250.Ptr =
                       local_250.Ptr +
                       ((long)local_250.N.field_0.field_0.Y * local_250.S.field_0.field_0.Z * lVar5
                       - local_250.D.field_0.field_0.Y * lVar5);
                }
              }
            }
            break;
          case float32:
            End<float>((grid_iterator<float> *)&local_1c8,Grid,Vol);
            Begin<float>((grid_iterator<float> *)&local_250,Grid,Vol);
            while (local_250.Ptr != local_1c8.Ptr) {
              *(float *)local_250.Ptr = (float)((double)*(float *)local_250.Ptr * dVar12);
              local_250.P.field_0.field_0.X =
                   local_250.P.field_0.field_0.X + local_250.S.field_0.field_0.X;
              local_250.Ptr =
                   (double *)((long)local_250.Ptr + (long)local_250.S.field_0.field_0.X * 4);
              if (local_250.D.field_0.field_0.X <= local_250.P.field_0.field_0.X) {
                local_250.P.field_0.field_0.X = 0;
                local_250.P.field_0.field_0.Y =
                     local_250.P.field_0.field_0.Y + local_250.S.field_0.field_0.Y;
                lVar5 = (long)local_250.N.field_0.field_0.X;
                local_250.Ptr =
                     (double *)
                     ((long)local_250.Ptr +
                     local_250.S.field_0.field_0.Y * lVar5 * 4 +
                     (long)local_250.D.field_0.field_0.X * -4);
                if (local_250.D.field_0.field_0.Y <= local_250.P.field_0.field_0.Y) {
                  local_250.P.field_0.field_0.Y = 0;
                  local_250.P.field_0.field_0.Z =
                       local_250.P.field_0.field_0.Z + local_250.S.field_0.field_0.Z;
                  local_250.Ptr =
                       (double *)
                       ((long)local_250.Ptr +
                       (long)local_250.N.field_0.field_0.Y * local_250.S.field_0.field_0.Z * lVar5 *
                       4 + local_250.D.field_0.field_0.Y * lVar5 * -4);
                }
              }
            }
            break;
          case float64:
            End<double>(&local_1c8,Grid,Vol);
            Begin<double>(&local_250,Grid,Vol);
            while (local_250.Ptr != local_1c8.Ptr) {
              *local_250.Ptr = dVar12 * *local_250.Ptr;
              local_250.P.field_0.field_0.X =
                   local_250.P.field_0.field_0.X + local_250.S.field_0.field_0.X;
              local_250.Ptr = local_250.Ptr + local_250.S.field_0.field_0.X;
              if (local_250.D.field_0.field_0.X <= local_250.P.field_0.field_0.X) {
                local_250.P.field_0.field_0.X = 0;
                local_250.P.field_0.field_0.Y =
                     local_250.P.field_0.field_0.Y + local_250.S.field_0.field_0.Y;
                lVar5 = (long)local_250.N.field_0.field_0.X;
                local_250.Ptr =
                     local_250.Ptr +
                     (local_250.S.field_0.field_0.Y * lVar5 - (long)local_250.D.field_0.field_0.X);
                if (local_250.D.field_0.field_0.Y <= local_250.P.field_0.field_0.Y) {
                  local_250.P.field_0.field_0.Y = 0;
                  local_250.P.field_0.field_0.Z =
                       local_250.P.field_0.field_0.Z + local_250.S.field_0.field_0.Z;
                  local_250.Ptr =
                       local_250.Ptr +
                       ((long)local_250.N.field_0.field_0.Y * local_250.S.field_0.field_0.Z * lVar5
                       - local_250.D.field_0.field_0.Y * lVar5);
                }
              }
            }
          }
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < local_178.Size);
    }
    paVar1 = local_190;
    if (local_188 == '\0') {
      (*local_190->Alloc->_vptr_allocator[1])(local_190->Alloc,local_190);
      paVar1->Size = 0;
      paVar1->Capacity = 0;
    }
  }
  return;
}

Assistant:

void
ForwardCdf53(const v3i& Dims3,
             const v3i& M3,
             int Iter,
             int NLevels,
             u64 TformOrder,
             volume* Vol,
             bool Normalize)
{
  idx2_Assert(Dims3 <= Dims(*Vol));
  int Level = 0;
  u64 PrevOrder = TformOrder;
  v3i D3 = Dims3;
  v3i R3 = D3;
  v3i S3(1);
  grid G(Dims3);
  while (Level < NLevels)
  {
    idx2_Assert(TformOrder != 0);
    int D = TformOrder & 0x3;
    TformOrder >>= 2;
    if (D == 3)
    {                      // next level
      if (TformOrder == 3) // next one is the last |
        TformOrder = PrevOrder;
      else
        PrevOrder = TformOrder;
      SetStrd(&G, S3);
      SetDims(&G, D3);
      R3 = D3;
      ++Level;
    }
    else
    {
#define Body(type)                                                                                 \
  switch (D)                                                                                       \
  {                                                                                                \
    case 0:                                                                                        \
      idx2_Assert(Dims3.X > 1);                                                                    \
      FLiftCdf53X<type>(G, M3, lift_option::Normal, Vol);                                          \
      break;                                                                                       \
    case 1:                                                                                        \
      idx2_Assert(Dims3.Y > 1);                                                                    \
      FLiftCdf53Y<type>(G, M3, lift_option::Normal, Vol);                                          \
      break;                                                                                       \
    case 2:                                                                                        \
      idx2_Assert(Dims3.Z > 1);                                                                    \
      FLiftCdf53Z<type>(G, M3, lift_option::Normal, Vol);                                          \
      break;                                                                                       \
    default:                                                                                       \
      idx2_Assert(false);                                                                          \
      break;                                                                                       \
  };
      idx2_DispatchOnType(Vol->Type);
#undef Body
      R3[D] = D3[D] + IsEven(D3[D]);
      SetDims(&G, R3);
      D3[D] = (R3[D] + 1) >> 1;
      S3[D] <<= 1;
    }
  }

  /* Optionally normalize */
  if (NLevels > 0 && Normalize)
  {
    idx2_Assert(IsFloatingPoint(Vol->Type));
    idx2_RAII(array<subband>, Subbands, BuildSubbands(Dims3, NLevels, TformOrder, &Subbands));
    auto BasisNorms = GetCdf53NormsFast<16>();
    for (int I = 0; I < Size(Subbands); ++I)
    {
      subband& S = Subbands[I];
      f64 Wx = Dims3.X == 1
                 ? 1
                 : (S.LowHigh3.X == 0 ? BasisNorms.ScalNorms[Iter * NLevels + S.Level3Rev.X - 1]
                                      : BasisNorms.WaveNorms[Iter * NLevels + S.Level3Rev.X]);
      f64 Wy = Dims3.Y == 1
                 ? 1
                 : (S.LowHigh3.Y == 0 ? BasisNorms.ScalNorms[Iter * NLevels + S.Level3Rev.Y - 1]
                                      : BasisNorms.WaveNorms[Iter * NLevels + S.Level3Rev.Y]);
      f64 Idx2 = Dims3.Z == 1
                   ? 1
                   : (S.LowHigh3.Z == 0 ? BasisNorms.ScalNorms[Iter * NLevels + S.Level3Rev.Z - 1]
                                        : BasisNorms.WaveNorms[Iter * NLevels + S.Level3Rev.Z]);
      f64 W = Wx * Wy * Idx2;
#define Body(type)                                                                                 \
  auto ItEnd = End<type>(S.Grid, *Vol);                                                            \
  for (auto It = Begin<type>(S.Grid, *Vol); It != ItEnd; ++It)                                     \
    *It = type(*It * W);
      idx2_DispatchOnType(Vol->Type);
#undef Body
    }
  }
}